

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::V0LayerParameter::SerializeWithCachedSizes(V0LayerParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  V0LayerParameter_PoolMethod value;
  uint uVar5;
  int32 iVar6;
  char *pcVar7;
  string *psVar8;
  BlobProto *value_00;
  UnknownFieldSet *unknown_fields;
  float fVar9;
  int local_70;
  int n_2;
  int i_2;
  int n_1;
  int i_1;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  V0LayerParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    name_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar7,iVar3,SERIALIZE,"caffe.V0LayerParameter.name");
    psVar8 = name_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,psVar8,output);
  }
  if ((uVar1 & 2) != 0) {
    type_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    type_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar7,iVar3,SERIALIZE,"caffe.V0LayerParameter.type");
    psVar8 = type_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(2,psVar8,output);
  }
  if ((uVar1 & 0x100) != 0) {
    uVar4 = num_output(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(3,uVar4,output);
  }
  if ((uVar1 & 0x800000) != 0) {
    bVar2 = biasterm(this);
    google::protobuf::internal::WireFormatLite::WriteBool(4,bVar2,output);
  }
  if ((uVar1 & 0x20) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (5,(MessageLite *)this->weight_filler_,output);
  }
  if ((uVar1 & 0x40) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (6,(MessageLite *)this->bias_filler_,output);
  }
  if ((uVar1 & 0x200) != 0) {
    uVar4 = pad(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(7,uVar4,output);
  }
  if ((uVar1 & 0x400) != 0) {
    uVar4 = kernelsize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(8,uVar4,output);
  }
  if ((uVar1 & 0x1000000) != 0) {
    uVar4 = group(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(9,uVar4,output);
  }
  if ((uVar1 & 0x2000000) != 0) {
    uVar4 = stride(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(10,uVar4,output);
  }
  if ((uVar1 & 0x800) != 0) {
    value = pool(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(0xb,value,output);
  }
  if ((uVar1 & 0x4000000) != 0) {
    fVar9 = dropout_ratio(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0xc,fVar9,output);
  }
  if ((uVar1 & 0x8000000) != 0) {
    uVar4 = local_size(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(0xd,uVar4,output);
  }
  if ((uVar1 & 0x10000000) != 0) {
    fVar9 = alpha(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0xe,fVar9,output);
  }
  if ((uVar1 & 0x20000000) != 0) {
    fVar9 = beta(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0xf,fVar9,output);
  }
  if ((uVar1 & 4) != 0) {
    source_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    source_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar7,iVar3,SERIALIZE,"caffe.V0LayerParameter.source");
    psVar8 = source_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x10,psVar8,output);
  }
  if ((uVar1 & 0x40000000) != 0) {
    fVar9 = scale(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x11,fVar9,output);
  }
  if ((uVar1 & 8) != 0) {
    meanfile_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    meanfile_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar7,iVar3,SERIALIZE,"caffe.V0LayerParameter.meanfile");
    psVar8 = meanfile_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x12,psVar8,output);
  }
  if ((uVar1 & 0x1000) != 0) {
    uVar4 = batchsize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(0x13,uVar4,output);
  }
  if ((uVar1 & 0x2000) != 0) {
    uVar4 = cropsize(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(0x14,uVar4,output);
  }
  if ((uVar1 & 0x8000) != 0) {
    bVar2 = mirror(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x15,bVar2,output);
  }
  if ((uVar1 & 0x80000000) != 0) {
    fVar9 = k(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x16,fVar9,output);
  }
  i_1 = 0;
  uVar5 = blobs_size(this);
  for (; (uint)i_1 < uVar5; i_1 = i_1 + 1) {
    value_00 = blobs(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x32,(MessageLite *)value_00,output);
  }
  i_2 = 0;
  iVar3 = blobs_lr_size(this);
  for (; i_2 < iVar3; i_2 = i_2 + 1) {
    fVar9 = blobs_lr(this,i_2);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x33,fVar9,output);
  }
  local_70 = 0;
  iVar3 = weight_decay_size(this);
  for (; local_70 < iVar3; local_70 = local_70 + 1) {
    fVar9 = weight_decay(this,local_70);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x34,fVar9,output);
  }
  if ((uVar1 & 0x20000) != 0) {
    uVar4 = rand_skip(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(0x35,uVar4,output);
  }
  uVar1 = (this->_has_bits_).has_bits_[1];
  if ((uVar1 & 1) != 0) {
    fVar9 = det_fg_threshold(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x36,fVar9,output);
  }
  if ((uVar1 & 2) != 0) {
    fVar9 = det_bg_threshold(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x37,fVar9,output);
  }
  if ((uVar1 & 4) != 0) {
    fVar9 = det_fg_fraction(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x38,fVar9,output);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x40000) != 0) {
    uVar4 = det_context_pad(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(0x3a,uVar4,output);
  }
  if ((uVar1 & 0x10) != 0) {
    det_crop_mode_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    det_crop_mode_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar7,iVar3,SERIALIZE,"caffe.V0LayerParameter.det_crop_mode");
    psVar8 = det_crop_mode_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x3b,psVar8,output);
  }
  if ((uVar1 & 0x80000) != 0) {
    iVar6 = new_num(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x3c,iVar6,output);
  }
  if ((uVar1 & 0x100000) != 0) {
    iVar6 = new_channels(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x3d,iVar6,output);
  }
  if ((uVar1 & 0x200000) != 0) {
    iVar6 = new_height(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x3e,iVar6,output);
  }
  if ((uVar1 & 0x4000) != 0) {
    iVar6 = new_width(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x3f,iVar6,output);
  }
  if ((uVar1 & 0x10000) != 0) {
    bVar2 = shuffle_images(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x40,bVar2,output);
  }
  if ((uVar1 & 0x400000) != 0) {
    uVar4 = concat_dim(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(0x41,uVar4,output);
  }
  if ((uVar1 & 0x80) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x3e9,(MessageLite *)this->hdf5_output_param_,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = V0LayerParameter::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void V0LayerParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.V0LayerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // optional string type = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.type");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->type(), output);
  }

  // optional uint32 num_output = 3;
  if (cached_has_bits & 0x00000100u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(3, this->num_output(), output);
  }

  // optional bool biasterm = 4 [default = true];
  if (cached_has_bits & 0x00800000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(4, this->biasterm(), output);
  }

  // optional .caffe.FillerParameter weight_filler = 5;
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      5, *this->weight_filler_, output);
  }

  // optional .caffe.FillerParameter bias_filler = 6;
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, *this->bias_filler_, output);
  }

  // optional uint32 pad = 7 [default = 0];
  if (cached_has_bits & 0x00000200u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(7, this->pad(), output);
  }

  // optional uint32 kernelsize = 8;
  if (cached_has_bits & 0x00000400u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(8, this->kernelsize(), output);
  }

  // optional uint32 group = 9 [default = 1];
  if (cached_has_bits & 0x01000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(9, this->group(), output);
  }

  // optional uint32 stride = 10 [default = 1];
  if (cached_has_bits & 0x02000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(10, this->stride(), output);
  }

  // optional .caffe.V0LayerParameter.PoolMethod pool = 11 [default = MAX];
  if (cached_has_bits & 0x00000800u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      11, this->pool(), output);
  }

  // optional float dropout_ratio = 12 [default = 0.5];
  if (cached_has_bits & 0x04000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(12, this->dropout_ratio(), output);
  }

  // optional uint32 local_size = 13 [default = 5];
  if (cached_has_bits & 0x08000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(13, this->local_size(), output);
  }

  // optional float alpha = 14 [default = 1];
  if (cached_has_bits & 0x10000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(14, this->alpha(), output);
  }

  // optional float beta = 15 [default = 0.75];
  if (cached_has_bits & 0x20000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(15, this->beta(), output);
  }

  // optional string source = 16;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source().data(), this->source().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.source");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      16, this->source(), output);
  }

  // optional float scale = 17 [default = 1];
  if (cached_has_bits & 0x40000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(17, this->scale(), output);
  }

  // optional string meanfile = 18;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->meanfile().data(), this->meanfile().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.meanfile");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      18, this->meanfile(), output);
  }

  // optional uint32 batchsize = 19;
  if (cached_has_bits & 0x00001000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(19, this->batchsize(), output);
  }

  // optional uint32 cropsize = 20 [default = 0];
  if (cached_has_bits & 0x00002000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(20, this->cropsize(), output);
  }

  // optional bool mirror = 21 [default = false];
  if (cached_has_bits & 0x00008000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(21, this->mirror(), output);
  }

  // optional float k = 22 [default = 1];
  if (cached_has_bits & 0x80000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(22, this->k(), output);
  }

  // repeated .caffe.BlobProto blobs = 50;
  for (unsigned int i = 0, n = this->blobs_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      50, this->blobs(i), output);
  }

  // repeated float blobs_lr = 51;
  for (int i = 0, n = this->blobs_lr_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(
      51, this->blobs_lr(i), output);
  }

  // repeated float weight_decay = 52;
  for (int i = 0, n = this->weight_decay_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(
      52, this->weight_decay(i), output);
  }

  // optional uint32 rand_skip = 53 [default = 0];
  if (cached_has_bits & 0x00020000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(53, this->rand_skip(), output);
  }

  cached_has_bits = _has_bits_[1];
  // optional float det_fg_threshold = 54 [default = 0.5];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(54, this->det_fg_threshold(), output);
  }

  // optional float det_bg_threshold = 55 [default = 0.5];
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(55, this->det_bg_threshold(), output);
  }

  // optional float det_fg_fraction = 56 [default = 0.25];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(56, this->det_fg_fraction(), output);
  }

  cached_has_bits = _has_bits_[0];
  // optional uint32 det_context_pad = 58 [default = 0];
  if (cached_has_bits & 0x00040000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(58, this->det_context_pad(), output);
  }

  // optional string det_crop_mode = 59 [default = "warp"];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->det_crop_mode().data(), this->det_crop_mode().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.det_crop_mode");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      59, this->det_crop_mode(), output);
  }

  // optional int32 new_num = 60 [default = 0];
  if (cached_has_bits & 0x00080000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(60, this->new_num(), output);
  }

  // optional int32 new_channels = 61 [default = 0];
  if (cached_has_bits & 0x00100000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(61, this->new_channels(), output);
  }

  // optional int32 new_height = 62 [default = 0];
  if (cached_has_bits & 0x00200000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(62, this->new_height(), output);
  }

  // optional int32 new_width = 63 [default = 0];
  if (cached_has_bits & 0x00004000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(63, this->new_width(), output);
  }

  // optional bool shuffle_images = 64 [default = false];
  if (cached_has_bits & 0x00010000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(64, this->shuffle_images(), output);
  }

  // optional uint32 concat_dim = 65 [default = 1];
  if (cached_has_bits & 0x00400000u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(65, this->concat_dim(), output);
  }

  // optional .caffe.HDF5OutputParameter hdf5_output_param = 1001;
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      1001, *this->hdf5_output_param_, output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.V0LayerParameter)
}